

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

char * readDataOfferAsString(wl_data_offer *offer,char *mimeType)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  void *block;
  ssize_t sVar4;
  ssize_t result;
  char *longer;
  size_t requiredSize;
  size_t readSize;
  size_t length;
  size_t size;
  char *string;
  int fds [2];
  char *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffc0;
  int32_t fd;
  char *in_stack_ffffffffffffffc8;
  long lVar5;
  wl_data_offer *in_stack_ffffffffffffffd0;
  void *pvVar6;
  char *local_28;
  int local_20;
  int local_1c;
  
  fd = (int32_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  iVar1 = pipe2(&local_20,0x80000);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    _glfwInputError(0x10008,"Wayland: Failed to create pipe for data offer: %s",pcVar3);
  }
  else {
    wl_data_offer_receive(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,fd);
    flushDisplay();
    close(local_1c);
    local_28 = (char *)0x0;
    pvVar6 = (void *)0x0;
    lVar5 = 0;
    do {
      while( true ) {
        block = (void *)(lVar5 + 0x1001);
        if ((pvVar6 < block) &&
           (in_stack_ffffffffffffffb0 =
                 (char *)_glfw_realloc(block,(size_t)in_stack_ffffffffffffffb0), pvVar6 = block,
           local_28 = in_stack_ffffffffffffffb0, in_stack_ffffffffffffffb0 == (char *)0x0)) {
          _glfwInputError(0x10005,(char *)0x0);
          close(local_20);
          return (char *)0x0;
        }
        sVar4 = read(local_20,local_28 + lVar5,0x1000);
        if (sVar4 == 0) {
          close(local_20);
          local_28[lVar5] = '\0';
          return local_28;
        }
        if (sVar4 == -1) break;
        lVar5 = sVar4 + lVar5;
      }
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    _glfwInputError(0x10008,"Wayland: Failed to read from data offer pipe: %s",pcVar3);
    close(local_20);
  }
  return (char *)0x0;
}

Assistant:

static char* readDataOfferAsString(struct wl_data_offer* offer, const char* mimeType)
{
    int fds[2];

    if (pipe2(fds, O_CLOEXEC) == -1)
    {
        _glfwInputError(GLFW_PLATFORM_ERROR,
                        "Wayland: Failed to create pipe for data offer: %s",
                        strerror(errno));
        return NULL;
    }

    wl_data_offer_receive(offer, mimeType, fds[1]);
    flushDisplay();
    close(fds[1]);

    char* string = NULL;
    size_t size = 0;
    size_t length = 0;

    for (;;)
    {
        const size_t readSize = 4096;
        const size_t requiredSize = length + readSize + 1;
        if (requiredSize > size)
        {
            char* longer = _glfw_realloc(string, requiredSize);
            if (!longer)
            {
                _glfwInputError(GLFW_OUT_OF_MEMORY, NULL);
                close(fds[0]);
                return NULL;
            }

            string = longer;
            size = requiredSize;
        }

        const ssize_t result = read(fds[0], string + length, readSize);
        if (result == 0)
            break;
        else if (result == -1)
        {
            if (errno == EINTR)
                continue;

            _glfwInputError(GLFW_PLATFORM_ERROR,
                            "Wayland: Failed to read from data offer pipe: %s",
                            strerror(errno));
            close(fds[0]);
            return NULL;
        }

        length += result;
    }

    close(fds[0]);

    string[length] = '\0';
    return string;
}